

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

bool __thiscall TPZFMatrix<long>::Compare(TPZFMatrix<long> *this,TPZSavable *copy,bool override)

{
  bool bVar1;
  TPZFMatrix<long> *A;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  stringstream sout;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (copy == (TPZSavable *)0x0) {
    A = (TPZFMatrix<long> *)0x0;
  }
  else {
    A = (TPZFMatrix<long> *)__dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
  }
  if (A != (TPZFMatrix<long> *)0x0) {
    bVar1 = TPZMatrix<long>::Compare(&this->super_TPZMatrix<long>,copy,false);
    lVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if (this->fElem[lVar4] != A->fElem[lVar4]) {
          bVar1 = false;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 - lVar4 != 0);
    }
    if (bVar1 != false) {
      return bVar1;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"virtual bool TPZFMatrix<long>::Compare(TPZSavable *, bool) [TVar = long]",
               0x48);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," did not compare ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," number different terms ",0x18);
    poVar2 = std::ostream::_M_insert<long>((long)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," number terms ",0xe);
    std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," difference in norm L1 ",0x17);
    std::ostream::_M_insert<long>((long)local_1a8);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1d8,local_1d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if (override) {
      operator=(this,A);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        this->operator=(*fmat);
    }
    return matresult;
}